

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
NormalMutexTest_BasicLock_Test<yamc::posix::rwlock>::~NormalMutexTest_BasicLock_Test
          (NormalMutexTest_BasicLock_Test<yamc::posix::rwlock> *this)

{
  NormalMutexTest_BasicLock_Test<yamc::posix::rwlock> *this_local;
  
  ~NormalMutexTest_BasicLock_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(NormalMutexTest, BasicLock)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        std::lock_guard<TypeParam> lk(mtx);
        counter = counter + 1;
        std::this_thread::yield();  // provoke lock contention
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}